

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O0

UINT8 Pulse_WriteData(void *drvObj,UINT32 dataSize,void *data)

{
  int iVar1;
  int retVal;
  DRV_PULSE *drv;
  void *data_local;
  UINT32 dataSize_local;
  void *drvObj_local;
  
  if (*(uint *)((long)drvObj + 0x1c) < dataSize) {
    drvObj_local._7_1_ = '\x02';
  }
  else {
    iVar1 = pa_simple_write(*(undefined8 *)((long)drvObj + 0x48),data,dataSize,0);
    if (iVar1 < 1) {
      drvObj_local._7_1_ = '\0';
    }
    else {
      drvObj_local._7_1_ = 0xff;
    }
  }
  return drvObj_local._7_1_;
}

Assistant:

UINT8 Pulse_WriteData(void* drvObj, UINT32 dataSize, void* data)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	int retVal;
	
	if (dataSize > drv->bufSize)
		return AERR_TOO_MUCH_DATA;
	
	retVal = pa_simple_write(drv->hPulse, data, (size_t) dataSize, NULL);
	if (retVal > 0)
		return 0xFF;
	
	return AERR_OK;
}